

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_readrewind(connectdata *conn)

{
  undefined1 *puVar1;
  int *piVar2;
  Curl_easy *data;
  curl_mimepart *pcVar3;
  CURLcode CVar4;
  uint uVar5;
  curlioerr cVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  curl_mimepart *part;
  
  data = conn->data;
  puVar1 = &(conn->bits).field_0x6;
  *puVar1 = *puVar1 & 0xfe;
  piVar2 = &(data->req).keepon;
  *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
  part = &(data->set).mimepost;
  if (((conn->handler->protocol & 3) != 0) &&
     (pcVar3 = *(data->req).protop, pcVar3 != (curl_mimepart *)0x0)) {
    part = pcVar3;
  }
  if ((data->set).postfields != (void *)0x0) {
    return CURLE_OK;
  }
  if ((data->set).httpreq - HTTPREQ_POST_FORM < 2) {
    CVar4 = Curl_mime_rewind(part);
    if (CVar4 == CURLE_OK) {
      return CURLE_OK;
    }
    pcVar9 = "Cannot rewind mime/post data";
LAB_004ebae4:
    Curl_failf(data,pcVar9);
  }
  else {
    if ((data->set).seek_func == (curl_seek_callback)0x0) {
      if ((data->set).ioctl_func == (curl_ioctl_callback)0x0) {
        if (((data->state).fread_func == fread) &&
           (iVar7 = fseek((FILE *)(data->state).in,0,0), iVar7 != -1)) {
          return CURLE_OK;
        }
        pcVar9 = "necessary data rewind wasn\'t possible";
        goto LAB_004ebae4;
      }
      Curl_set_in_callback(data,true);
      cVar6 = (*(data->set).ioctl_func)(data,1,(data->set).ioctl_client);
      uVar8 = (ulong)cVar6;
      Curl_set_in_callback(data,false);
      Curl_infof(data,"the ioctl callback returned %d\n",uVar8);
      if (cVar6 == CURLIOE_OK) {
        return CURLE_OK;
      }
      pcVar9 = "ioctl callback returned error %d";
    }
    else {
      Curl_set_in_callback(data,true);
      uVar5 = (*(data->set).seek_func)((data->set).seek_client,0,0);
      uVar8 = (ulong)uVar5;
      Curl_set_in_callback(data,false);
      if (uVar5 == 0) {
        return CURLE_OK;
      }
      pcVar9 = "seek callback returned error %d";
    }
    Curl_failf(data,pcVar9,uVar8);
  }
  return CURLE_SEND_FAIL_REWIND;
}

Assistant:

CURLcode Curl_readrewind(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  curl_mimepart *mimepart = &data->set.mimepost;

  conn->bits.rewindaftersend = FALSE; /* we rewind now */

  /* explicitly switch off sending data on this connection now since we are
     about to restart a new transfer and thus we want to avoid inadvertently
     sending more data on the existing connection until the next transfer
     starts */
  data->req.keepon &= ~KEEP_SEND;

  /* We have sent away data. If not using CURLOPT_POSTFIELDS or
     CURLOPT_HTTPPOST, call app to rewind
  */
  if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
    struct HTTP *http = data->req.protop;

    if(http->sendit)
      mimepart = http->sendit;
  }
  if(data->set.postfields)
    ; /* do nothing */
  else if(data->set.httpreq == HTTPREQ_POST_MIME ||
          data->set.httpreq == HTTPREQ_POST_FORM) {
    if(Curl_mime_rewind(mimepart)) {
      failf(data, "Cannot rewind mime/post data");
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else {
    if(data->set.seek_func) {
      int err;

      Curl_set_in_callback(data, true);
      err = (data->set.seek_func)(data->set.seek_client, 0, SEEK_SET);
      Curl_set_in_callback(data, false);
      if(err) {
        failf(data, "seek callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else if(data->set.ioctl_func) {
      curlioerr err;

      Curl_set_in_callback(data, true);
      err = (data->set.ioctl_func)(data, CURLIOCMD_RESTARTREAD,
                                   data->set.ioctl_client);
      Curl_set_in_callback(data, false);
      infof(data, "the ioctl callback returned %d\n", (int)err);

      if(err) {
        failf(data, "ioctl callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      /* If no CURLOPT_READFUNCTION is used, we know that we operate on a
         given FILE * stream and we can actually attempt to rewind that
         ourselves with fseek() */
      if(data->state.fread_func == (curl_read_callback)fread) {
        if(-1 != fseek(data->state.in, 0, SEEK_SET))
          /* successful rewind */
          return CURLE_OK;
      }

      /* no callback set or failure above, makes us fail at once */
      failf(data, "necessary data rewind wasn't possible");
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  return CURLE_OK;
}